

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O2

size_t EBML_FillBufferID(uint8_t *Buffer,size_t BufSize,fourcc_t Id)

{
  long lVar1;
  uint8_t *puVar2;
  ulong uStack_8;
  
  if (Id < 0x100) {
    uStack_8 = 1;
  }
  else if (Id < 0x10000) {
    uStack_8 = 2;
  }
  else {
    uStack_8 = 4 - (ulong)(Id < 0x1000000);
  }
  if (BufSize < uStack_8) {
    uStack_8 = 0;
  }
  else {
    puVar2 = Buffer + uStack_8;
    for (lVar1 = 0; puVar2 = puVar2 + -1, uStack_8 * 8 - lVar1 != 0; lVar1 = lVar1 + 8) {
      *puVar2 = (uint8_t)(Id >> ((byte)lVar1 & 0x1f));
    }
  }
  return uStack_8;
}

Assistant:

size_t EBML_FillBufferID(uint8_t *Buffer, size_t BufSize, fourcc_t Id)
{
    size_t i,FinalHeadSize = GetIdLength(Id);
    if (BufSize < FinalHeadSize)
        return 0;
    for (i=0;i<FinalHeadSize;++i)
        Buffer[FinalHeadSize-i-1] = (uint8_t)(Id >> (i<<3));
    return FinalHeadSize;
}